

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O0

int mbedtls_pk_parse_key(mbedtls_pk_context *pk,uchar *key,size_t keylen,uchar *pwd,size_t pwdlen)

{
  int iVar1;
  mbedtls_pk_info_t *pmVar2;
  mbedtls_rsa_context *pmVar3;
  mbedtls_ecp_keypair *pmVar4;
  undefined1 local_68 [8];
  mbedtls_pem_context pem;
  size_t len;
  mbedtls_pk_info_t *pk_info;
  int ret;
  size_t pwdlen_local;
  uchar *pwd_local;
  size_t keylen_local;
  uchar *key_local;
  mbedtls_pk_context *pk_local;
  
  mbedtls_pem_init((mbedtls_pem_context *)local_68);
  if ((keylen == 0) || (key[keylen - 1] != '\0')) {
    pk_info._4_4_ = -0x1080;
  }
  else {
    pk_info._4_4_ =
         mbedtls_pem_read_buffer
                   ((mbedtls_pem_context *)local_68,"-----BEGIN RSA PRIVATE KEY-----",
                    "-----END RSA PRIVATE KEY-----",key,pwd,pwdlen,(size_t *)&pem.info);
  }
  if (pk_info._4_4_ != 0) {
    if (pk_info._4_4_ == -0x1380) {
      return -0x3b80;
    }
    if (pk_info._4_4_ == -0x1300) {
      return -0x3c00;
    }
    if (pk_info._4_4_ != -0x1080) {
      return pk_info._4_4_;
    }
    if ((keylen == 0) || (key[keylen - 1] != '\0')) {
      pk_info._4_4_ = -0x1080;
    }
    else {
      pk_info._4_4_ =
           mbedtls_pem_read_buffer
                     ((mbedtls_pem_context *)local_68,"-----BEGIN EC PRIVATE KEY-----",
                      "-----END EC PRIVATE KEY-----",key,pwd,pwdlen,(size_t *)&pem.info);
    }
    if (pk_info._4_4_ != 0) {
      if (pk_info._4_4_ == -0x1380) {
        return -0x3b80;
      }
      if (pk_info._4_4_ == -0x1300) {
        return -0x3c00;
      }
      if (pk_info._4_4_ != -0x1080) {
        return pk_info._4_4_;
      }
      if ((keylen == 0) || (key[keylen - 1] != '\0')) {
        pk_info._4_4_ = -0x1080;
      }
      else {
        pk_info._4_4_ =
             mbedtls_pem_read_buffer
                       ((mbedtls_pem_context *)local_68,"-----BEGIN PRIVATE KEY-----",
                        "-----END PRIVATE KEY-----",key,(uchar *)0x0,0,(size_t *)&pem.info);
      }
      if (pk_info._4_4_ == 0) {
        iVar1 = pk_parse_key_pkcs8_unencrypted_der(pk,(uchar *)local_68,(size_t)pem.buf);
        if (iVar1 != 0) {
          mbedtls_pk_free(pk);
        }
        mbedtls_pem_free((mbedtls_pem_context *)local_68);
        return iVar1;
      }
      if (pk_info._4_4_ != -0x1080) {
        return pk_info._4_4_;
      }
      if ((keylen == 0) || (key[keylen - 1] != '\0')) {
        pk_info._4_4_ = -0x1080;
      }
      else {
        pk_info._4_4_ =
             mbedtls_pem_read_buffer
                       ((mbedtls_pem_context *)local_68,"-----BEGIN ENCRYPTED PRIVATE KEY-----",
                        "-----END ENCRYPTED PRIVATE KEY-----",key,(uchar *)0x0,0,(size_t *)&pem.info
                       );
      }
      if (pk_info._4_4_ == 0) {
        iVar1 = pk_parse_key_pkcs8_encrypted_der(pk,(uchar *)local_68,(size_t)pem.buf,pwd,pwdlen);
        if (iVar1 != 0) {
          mbedtls_pk_free(pk);
        }
        mbedtls_pem_free((mbedtls_pem_context *)local_68);
        return iVar1;
      }
      if (pk_info._4_4_ != -0x1080) {
        return pk_info._4_4_;
      }
      iVar1 = pk_parse_key_pkcs8_encrypted_der(pk,key,keylen,pwd,pwdlen);
      if (iVar1 == 0) {
        return 0;
      }
      mbedtls_pk_free(pk);
      if (iVar1 == -0x3b80) {
        return -0x3b80;
      }
      iVar1 = pk_parse_key_pkcs8_unencrypted_der(pk,key,keylen);
      if (iVar1 == 0) {
        return 0;
      }
      mbedtls_pk_free(pk);
      pmVar2 = mbedtls_pk_info_from_type(MBEDTLS_PK_RSA);
      if (pmVar2 == (mbedtls_pk_info_t *)0x0) {
        return -0x3c80;
      }
      iVar1 = mbedtls_pk_setup(pk,pmVar2);
      if (iVar1 == 0) {
        pmVar3 = mbedtls_pk_rsa(*pk);
        iVar1 = pk_parse_key_pkcs1_der(pmVar3,key,keylen);
        if (iVar1 != 0) {
          mbedtls_pk_free(pk);
          pmVar2 = mbedtls_pk_info_from_type(MBEDTLS_PK_ECKEY);
          if (pmVar2 == (mbedtls_pk_info_t *)0x0) {
            return -0x3c80;
          }
          iVar1 = mbedtls_pk_setup(pk,pmVar2);
          if (iVar1 == 0) {
            pmVar4 = mbedtls_pk_ec(*pk);
            iVar1 = pk_parse_key_sec1_der(pmVar4,key,keylen);
            if (iVar1 != 0) {
              mbedtls_pk_free(pk);
              return -0x3d00;
            }
          }
          return 0;
        }
      }
      return 0;
    }
    pmVar2 = mbedtls_pk_info_from_type(MBEDTLS_PK_ECKEY);
    if (pmVar2 == (mbedtls_pk_info_t *)0x0) {
      return -0x3c80;
    }
    pk_info._4_4_ = mbedtls_pk_setup(pk,pmVar2);
    if (pk_info._4_4_ == 0) {
      pmVar4 = mbedtls_pk_ec(*pk);
      pk_info._4_4_ = pk_parse_key_sec1_der(pmVar4,(uchar *)local_68,(size_t)pem.buf);
      if (pk_info._4_4_ == 0) goto LAB_0012615b;
    }
    mbedtls_pk_free(pk);
LAB_0012615b:
    mbedtls_pem_free((mbedtls_pem_context *)local_68);
    return pk_info._4_4_;
  }
  pmVar2 = mbedtls_pk_info_from_type(MBEDTLS_PK_RSA);
  if (pmVar2 == (mbedtls_pk_info_t *)0x0) {
    return -0x3c80;
  }
  pk_info._4_4_ = mbedtls_pk_setup(pk,pmVar2);
  if (pk_info._4_4_ == 0) {
    pmVar3 = mbedtls_pk_rsa(*pk);
    pk_info._4_4_ = pk_parse_key_pkcs1_der(pmVar3,(uchar *)local_68,(size_t)pem.buf);
    if (pk_info._4_4_ == 0) goto LAB_00126044;
  }
  mbedtls_pk_free(pk);
LAB_00126044:
  mbedtls_pem_free((mbedtls_pem_context *)local_68);
  return pk_info._4_4_;
}

Assistant:

int mbedtls_pk_parse_key( mbedtls_pk_context *pk,
                  const unsigned char *key, size_t keylen,
                  const unsigned char *pwd, size_t pwdlen )
{
    int ret;
    const mbedtls_pk_info_t *pk_info;

#if defined(MBEDTLS_PEM_PARSE_C)
    size_t len;
    mbedtls_pem_context pem;

    mbedtls_pem_init( &pem );

#if defined(MBEDTLS_RSA_C)
    /* Avoid calling mbedtls_pem_read_buffer() on non-null-terminated string */
    if( keylen == 0 || key[keylen - 1] != '\0' )
        ret = MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT;
    else
        ret = mbedtls_pem_read_buffer( &pem,
                               "-----BEGIN RSA PRIVATE KEY-----",
                               "-----END RSA PRIVATE KEY-----",
                               key, pwd, pwdlen, &len );

    if( ret == 0 )
    {
        if( ( pk_info = mbedtls_pk_info_from_type( MBEDTLS_PK_RSA ) ) == NULL )
            return( MBEDTLS_ERR_PK_UNKNOWN_PK_ALG );

        if( ( ret = mbedtls_pk_setup( pk, pk_info                    ) ) != 0 ||
            ( ret = pk_parse_key_pkcs1_der( mbedtls_pk_rsa( *pk ),
                                            pem.buf, pem.buflen ) ) != 0 )
        {
            mbedtls_pk_free( pk );
        }

        mbedtls_pem_free( &pem );
        return( ret );
    }
    else if( ret == MBEDTLS_ERR_PEM_PASSWORD_MISMATCH )
        return( MBEDTLS_ERR_PK_PASSWORD_MISMATCH );
    else if( ret == MBEDTLS_ERR_PEM_PASSWORD_REQUIRED )
        return( MBEDTLS_ERR_PK_PASSWORD_REQUIRED );
    else if( ret != MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT )
        return( ret );
#endif /* MBEDTLS_RSA_C */

#if defined(MBEDTLS_ECP_C)
    /* Avoid calling mbedtls_pem_read_buffer() on non-null-terminated string */
    if( keylen == 0 || key[keylen - 1] != '\0' )
        ret = MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT;
    else
        ret = mbedtls_pem_read_buffer( &pem,
                               "-----BEGIN EC PRIVATE KEY-----",
                               "-----END EC PRIVATE KEY-----",
                               key, pwd, pwdlen, &len );
    if( ret == 0 )
    {
        if( ( pk_info = mbedtls_pk_info_from_type( MBEDTLS_PK_ECKEY ) ) == NULL )
            return( MBEDTLS_ERR_PK_UNKNOWN_PK_ALG );

        if( ( ret = mbedtls_pk_setup( pk, pk_info                   ) ) != 0 ||
            ( ret = pk_parse_key_sec1_der( mbedtls_pk_ec( *pk ),
                                           pem.buf, pem.buflen ) ) != 0 )
        {
            mbedtls_pk_free( pk );
        }

        mbedtls_pem_free( &pem );
        return( ret );
    }
    else if( ret == MBEDTLS_ERR_PEM_PASSWORD_MISMATCH )
        return( MBEDTLS_ERR_PK_PASSWORD_MISMATCH );
    else if( ret == MBEDTLS_ERR_PEM_PASSWORD_REQUIRED )
        return( MBEDTLS_ERR_PK_PASSWORD_REQUIRED );
    else if( ret != MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT )
        return( ret );
#endif /* MBEDTLS_ECP_C */

    /* Avoid calling mbedtls_pem_read_buffer() on non-null-terminated string */
    if( keylen == 0 || key[keylen - 1] != '\0' )
        ret = MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT;
    else
        ret = mbedtls_pem_read_buffer( &pem,
                               "-----BEGIN PRIVATE KEY-----",
                               "-----END PRIVATE KEY-----",
                               key, NULL, 0, &len );
    if( ret == 0 )
    {
        if( ( ret = pk_parse_key_pkcs8_unencrypted_der( pk,
                                                pem.buf, pem.buflen ) ) != 0 )
        {
            mbedtls_pk_free( pk );
        }

        mbedtls_pem_free( &pem );
        return( ret );
    }
    else if( ret != MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT )
        return( ret );

#if defined(MBEDTLS_PKCS12_C) || defined(MBEDTLS_PKCS5_C)
    /* Avoid calling mbedtls_pem_read_buffer() on non-null-terminated string */
    if( keylen == 0 || key[keylen - 1] != '\0' )
        ret = MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT;
    else
        ret = mbedtls_pem_read_buffer( &pem,
                               "-----BEGIN ENCRYPTED PRIVATE KEY-----",
                               "-----END ENCRYPTED PRIVATE KEY-----",
                               key, NULL, 0, &len );
    if( ret == 0 )
    {
        if( ( ret = pk_parse_key_pkcs8_encrypted_der( pk,
                                                      pem.buf, pem.buflen,
                                                      pwd, pwdlen ) ) != 0 )
        {
            mbedtls_pk_free( pk );
        }

        mbedtls_pem_free( &pem );
        return( ret );
    }
    else if( ret != MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT )
        return( ret );
#endif /* MBEDTLS_PKCS12_C || MBEDTLS_PKCS5_C */
#else
    ((void) ret);
    ((void) pwd);
    ((void) pwdlen);
#endif /* MBEDTLS_PEM_PARSE_C */

    /*
     * At this point we only know it's not a PEM formatted key. Could be any
     * of the known DER encoded private key formats
     *
     * We try the different DER format parsers to see if one passes without
     * error
     */
#if defined(MBEDTLS_PKCS12_C) || defined(MBEDTLS_PKCS5_C)
    if( ( ret = pk_parse_key_pkcs8_encrypted_der( pk, key, keylen,
                                                  pwd, pwdlen ) ) == 0 )
    {
        return( 0 );
    }

    mbedtls_pk_free( pk );

    if( ret == MBEDTLS_ERR_PK_PASSWORD_MISMATCH )
    {
        return( ret );
    }
#endif /* MBEDTLS_PKCS12_C || MBEDTLS_PKCS5_C */

    if( ( ret = pk_parse_key_pkcs8_unencrypted_der( pk, key, keylen ) ) == 0 )
        return( 0 );

    mbedtls_pk_free( pk );

#if defined(MBEDTLS_RSA_C)
    if( ( pk_info = mbedtls_pk_info_from_type( MBEDTLS_PK_RSA ) ) == NULL )
        return( MBEDTLS_ERR_PK_UNKNOWN_PK_ALG );

    if( ( ret = mbedtls_pk_setup( pk, pk_info                           ) ) != 0 ||
        ( ret = pk_parse_key_pkcs1_der( mbedtls_pk_rsa( *pk ), key, keylen ) ) == 0 )
    {
        return( 0 );
    }

    mbedtls_pk_free( pk );
#endif /* MBEDTLS_RSA_C */

#if defined(MBEDTLS_ECP_C)
    if( ( pk_info = mbedtls_pk_info_from_type( MBEDTLS_PK_ECKEY ) ) == NULL )
        return( MBEDTLS_ERR_PK_UNKNOWN_PK_ALG );

    if( ( ret = mbedtls_pk_setup( pk, pk_info                         ) ) != 0 ||
        ( ret = pk_parse_key_sec1_der( mbedtls_pk_ec( *pk ), key, keylen ) ) == 0 )
    {
        return( 0 );
    }

    mbedtls_pk_free( pk );
#endif /* MBEDTLS_ECP_C */

    return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT );
}